

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

bool __thiscall S2BooleanOperation::Impl::Build(Impl *this,S2Error *error)

{
  S2BooleanOperation *pSVar1;
  S2Builder *this_00;
  __uniq_ptr_impl<S2Builder,_std::default_delete<S2Builder>_> __p;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  S2Error *error_00;
  pointer *__ptr;
  Graph *g;
  __uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> local_c8;
  __uniq_ptr_impl<S2Builder,_std::default_delete<S2Builder>_> local_c0;
  Options local_b8;
  undefined1 local_a8;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  _Any_data local_70;
  undefined8 local_60;
  undefined8 uStack_58;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  error->code_ = OK;
  (error->text_)._M_string_length = 0;
  *(error->text_)._M_dataplus._M_p = '\0';
  pSVar1 = this->op_;
  if (pSVar1->result_empty_ == (bool *)0x0) {
    S2Builder::Options::Options
              (&local_b8,
               (SnapFunction *)
               (pSVar1->options_).snap_function_._M_t.
               super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
               ._M_t.
               super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
               .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>);
    uVar2 = local_b8._8_8_;
    local_b8.split_crossing_edges_ = true;
    uVar3 = local_b8._8_8_;
    local_b8._11_5_ = SUB85(uVar2,3);
    local_b8._8_2_ = SUB82(uVar3,0);
    local_b8.idempotent_ = false;
    absl::make_unique<S2Builder,S2Builder::Options&>((absl *)&local_c0,&local_b8);
    __p._M_t.super__Tuple_impl<0UL,_S2Builder_*,_std::default_delete<S2Builder>_>.
    super__Head_base<0UL,_S2Builder_*,_false>._M_head_impl =
         local_c0._M_t.super__Tuple_impl<0UL,_S2Builder_*,_std::default_delete<S2Builder>_>.
         super__Head_base<0UL,_S2Builder_*,_false>._M_head_impl;
    local_c0._M_t.super__Tuple_impl<0UL,_S2Builder_*,_std::default_delete<S2Builder>_>.
    super__Head_base<0UL,_S2Builder_*,_false>._M_head_impl =
         (tuple<S2Builder_*,_std::default_delete<S2Builder>_>)
         (_Tuple_impl<0UL,_S2Builder_*,_std::default_delete<S2Builder>_>)0x0;
    std::__uniq_ptr_impl<S2Builder,_std::default_delete<S2Builder>_>::reset
              ((__uniq_ptr_impl<S2Builder,_std::default_delete<S2Builder>_> *)&this->builder_,
               (pointer)__p._M_t.
                        super__Tuple_impl<0UL,_S2Builder_*,_std::default_delete<S2Builder>_>.
                        super__Head_base<0UL,_S2Builder_*,_false>._M_head_impl);
    std::unique_ptr<S2Builder,_std::default_delete<S2Builder>_>::~unique_ptr
              ((unique_ptr<S2Builder,_std::default_delete<S2Builder>_> *)&local_c0);
    pSVar1 = this->op_;
    this_00 = (this->builder_)._M_t.
              super___uniq_ptr_impl<S2Builder,_std::default_delete<S2Builder>_>._M_t.
              super__Tuple_impl<0UL,_S2Builder_*,_std::default_delete<S2Builder>_>.
              super__Head_base<0UL,_S2Builder_*,_false>._M_head_impl;
    local_c8._M_t.super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
    .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl =
         (tuple<S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>)operator_new(0x20);
    *(undefined ***)
     local_c8._M_t.
     super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
     super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl = &PTR__Layer_00304230;
    *(vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
      **)((long)local_c8._M_t.
                super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
                super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl + 8) =
         &pSVar1->layers_;
    *(vector<signed_char,_std::allocator<signed_char>_> **)
     ((long)local_c8._M_t.
            super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
            super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl + 0x10) =
         &this->input_dimensions_;
    *(InputEdgeCrossings **)
     ((long)local_c8._M_t.
            super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
            super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl + 0x18) =
         &this->input_crossings_;
    S2Builder::StartLayer
              (this_00,(unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> *)
                       &local_c8);
    if ((_Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>)
        local_c8._M_t.
        super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
        super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl != (Layer *)0x0) {
      (**(code **)(*(long *)local_c8._M_t.
                            super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                            .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl + 8))();
    }
    local_c8._M_t.super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
    .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl =
         (tuple<S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>)
         (_Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>)0x0;
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<bool_(const_S2Builder::Graph_&,_S2Error_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc:2255:7)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<bool_(const_S2Builder::Graph_&,_S2Error_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc:2255:7)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    S2Builder::AddIsFullPolygonPredicate
              ((this->builder_)._M_t.
               super___uniq_ptr_impl<S2Builder,_std::default_delete<S2Builder>_>._M_t.
               super__Tuple_impl<0UL,_S2Builder_*,_std::default_delete<S2Builder>_>.
               super__Head_base<0UL,_S2Builder_*,_false>._M_head_impl,
               (IsFullPolygonPredicate *)&local_48);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    BuildOpType(this,this->op_->op_type_);
    bVar4 = S2Builder::Build((this->builder_)._M_t.
                             super___uniq_ptr_impl<S2Builder,_std::default_delete<S2Builder>_>._M_t.
                             super__Tuple_impl<0UL,_S2Builder_*,_std::default_delete<S2Builder>_>.
                             super__Head_base<0UL,_S2Builder_*,_false>._M_head_impl,error);
    if (local_b8.snap_function_._M_t.
        super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
        ._M_t.
        super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
        .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>)0x0
       ) {
      (*(*(_func_int ***)
          local_b8.snap_function_._M_t.
          super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
          ._M_t.
          super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
          .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl)[1])();
    }
  }
  else {
    local_b8.snap_function_._M_t.
    super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>.
    _M_t.
    super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
    .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl =
         (__uniq_ptr_data<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>,_true,_true>
          )(__uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>)
           0x200000000;
    local_b8.split_crossing_edges_ = true;
    local_b8.simplify_edge_chains_ = false;
    local_b8.idempotent_ = false;
    local_b8._11_5_ = 0x200;
    local_a8 = 1;
    local_a4 = 0xffffffff;
    local_a0 = 0;
    uStack_98 = 0;
    local_90 = 0;
    uStack_88 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_70._M_unused._M_object = (void *)0x0;
    local_70._8_8_ = 0;
    local_60 = 0;
    uStack_58 = 0;
    g = (Graph *)(ulong)pSVar1->op_type_;
    bVar4 = BuildOpType(this,pSVar1->op_type_);
    if (bVar4) {
      bVar4 = IsFullPolygonResult(this,g,error_00);
      bVar4 = !bVar4;
    }
    else {
      bVar4 = false;
    }
    *this->op_->result_empty_ = bVar4;
    std::_Function_base::~_Function_base((_Function_base *)&local_70);
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool S2BooleanOperation::Impl::Build(S2Error* error) {
  error->Clear();
  if (is_boolean_output()) {
    // BuildOpType() returns true if and only if the result has no edges.
    S2Builder::Graph g;  // Unused by IsFullPolygonResult() implementation.
    *op_->result_empty_ =
        BuildOpType(op_->op_type()) && !IsFullPolygonResult(g, error);
    return true;
  }
  // TODO(ericv): Rather than having S2Builder split the edges, it would be
  // faster to call AddVertex() in this class and have a new S2Builder
  // option that increases the edge_snap_radius_ to account for errors in
  // the intersection point (the way that split_crossing_edges does).
  S2Builder::Options options(op_->options_.snap_function());
  options.set_split_crossing_edges(true);

  // TODO(ericv): Ideally idempotent() should be true, but existing clients
  // expect vertices closer than the full "snap_radius" to be snapped.
  options.set_idempotent(false);
  builder_ = make_unique<S2Builder>(options);
  builder_->StartLayer(make_unique<EdgeClippingLayer>(
      &op_->layers_, &input_dimensions_, &input_crossings_));

  // Add a predicate that decides whether a result with no polygon edges should
  // be interpreted as the empty polygon or the full polygon.
  builder_->AddIsFullPolygonPredicate(
      [this](const S2Builder::Graph& g, S2Error* error) {
        return IsFullPolygonResult(g, error);
      });
  (void) BuildOpType(op_->op_type());
  return builder_->Build(error);
}